

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_abs_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  fVar2 = c->in[0].m_data[3];
  fVar3 = c->in[1].m_data[1];
  fVar4 = c->in[1].m_data[2];
  fVar1 = c->in[0].m_data[1];
  auVar5._0_8_ = CONCAT44(fVar1,fVar2) ^ 0x8000000080000000;
  auVar5._8_4_ = -fVar3;
  auVar5._12_4_ = -fVar4;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar2;
  auVar6._8_4_ = fVar3;
  auVar6._12_4_ = fVar4;
  auVar6 = maxps(auVar5,auVar6);
  *(long *)((c->color).m_data + 1) = auVar6._0_8_;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }